

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_11c774f::TLL::HandleLibrary
          (TLL *this,ProcessingState currentProcessingState,string *lib,cmTargetLinkLibraryType llt)

{
  uint uVar1;
  _Map_pointer ppvVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  TargetType TVar5;
  PolicyStatus PVar6;
  cmListFileContext *lfc;
  string *psVar7;
  ostream *poVar8;
  size_t sVar9;
  cmGlobalGenerator *this_00;
  cmTarget *pcVar10;
  size_type sVar11;
  long *plVar12;
  cmake *this_01;
  cmValue cVar13;
  size_type *psVar14;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID id;
  PolicyID extraout_EDX_01;
  PolicyID extraout_EDX_02;
  PolicyID id_00;
  cmTargetLinkLibraryType llt_00;
  string *dc;
  cmMakefile *pcVar15;
  char *pcVar16;
  char *pcVar17;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  ostringstream e;
  undefined1 local_228 [52];
  cmTargetLinkLibraryType local_1f4;
  undefined8 local_1f0;
  string local_1e8;
  undefined4 local_1c4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  size_type local_188;
  char *local_180;
  size_type local_178;
  pointer local_170;
  size_type local_168;
  char *local_160;
  undefined8 local_158;
  char *local_150;
  ios_base local_138 [264];
  
  TVar5 = cmTarget::GetType(this->Target);
  if ((currentProcessingState == ProcessingKeywordLinkInterface) || (TVar5 != INTERFACE_LIBRARY)) {
    bVar4 = cmTarget::IsImported(this->Target);
    if ((currentProcessingState == ProcessingKeywordLinkInterface) || (!bVar4)) {
      pcVar10 = this->Target;
      local_1f4 = llt;
      cmMakefile::GetBacktrace(this->Makefile);
      lfc = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                      ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_1a8);
      uVar1 = currentProcessingState - ProcessingKeywordLinkInterface;
      bVar4 = cmTarget::PushTLLCommandTrace(pcVar10,(uint)(4 < uVar1),lfc);
      id_00 = extraout_EDX;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
        id_00 = extraout_EDX_00;
      }
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        PVar6 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0023,false);
        if (PVar6 - NEW < 3) {
          pcVar17 = "must";
          local_1f0 = (cmMakefile *)CONCAT44(local_1f0._4_4_,2);
          local_1c4 = (undefined4)CONCAT71((uint7)(uint3)(PVar6 >> 8),1);
LAB_0035611d:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The ",4);
          pcVar16 = "keyword";
          if (4 >= uVar1) {
            pcVar16 = "plain";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,pcVar16,(ulong)(4 < uVar1) * 2 + 5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     " signature for target_link_libraries has already been used with the target \""
                     ,0x4c);
          psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar7->_M_dataplus)._M_p,
                              psVar7->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\".  All uses of target_link_libraries with a target ",0x34);
          sVar9 = strlen(pcVar17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar17,sVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," be either all-keyword or all-plain.\n",0x25);
          cmTarget::GetTllSignatureTraces(this->Target,(ostream *)local_1a8,(uint)(uVar1 < 5));
          pcVar15 = this->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar15,(MessageType)local_1f0,(string *)local_228);
          if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
            operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
          }
          if ((char)local_1c4 != '\0') {
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            return false;
          }
        }
        else if (PVar6 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_228,(cmPolicies *)0x17,id);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_228._0_8_,local_228._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
            operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
          }
          pcVar17 = "should";
          local_1c4 = 0;
          local_1f0 = (cmMakefile *)((ulong)local_1f0._4_4_ << 0x20);
          goto LAB_0035611d;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        id_00 = extraout_EDX_01;
      }
      llt_00 = local_1f4;
      if (0xfffffffd < currentProcessingState - ProcessingPlainPublicInterface) {
LAB_003564d9:
        if (this->WarnRemoteInterface == true) {
          pcVar15 = this->Makefile;
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0x4f,id_00);
          _Var3._M_p = local_1e8._M_dataplus._M_p;
          psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
          local_1a8._0_8_ = local_1e8._M_string_length;
          local_1a8._8_8_ = _Var3._M_p;
          local_198._0_8_ = 10;
          local_198._8_8_ = "\nTarget\n  ";
          local_180 = (psVar7->_M_dataplus)._M_p;
          local_188 = psVar7->_M_string_length;
          local_178 = 99;
          local_170 = 
          "\nis not created in this directory.  For compatibility with older versions of CMake, link library\n  "
          ;
          local_160 = (lib->_M_dataplus)._M_p;
          local_168 = lib->_M_string_length;
          local_158 = 0x6a;
          local_150 = 
          "\nwill be looked up in the directory in which the target was created rather than in this calling directory."
          ;
          views_00._M_len = 6;
          views_00._M_array = (iterator)local_1a8;
          cmCatViews_abi_cxx11_((string *)local_228,views_00);
          cmMakefile::IssueMessage(pcVar15,AUTHOR_WARNING,(string *)local_228);
          llt_00 = local_1f4;
          if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
            operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
        }
        if (currentProcessingState - ProcessingPlainPrivateInterface < 2) {
          TVar5 = cmTarget::GetType(this->Target);
          if ((TVar5 != STATIC_LIBRARY) &&
             (TVar5 = cmTarget::GetType(this->Target), TVar5 != OBJECT_LIBRARY)) {
            return true;
          }
          cmTarget::GetDebugGeneratorExpressions((string *)local_1a8,this->Target,lib,llt_00);
          bVar4 = cmGeneratorExpression::IsValidTargetName(lib);
          if ((bVar4) || (sVar11 = cmGeneratorExpression::Find(lib), sVar11 != 0xffffffffffffffff))
          {
            std::operator+(&local_1e8,"$<LINK_ONLY:",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_1e8);
            psVar14 = (size_type *)(plVar12 + 2);
            if ((size_type *)*plVar12 == psVar14) {
              local_228._16_8_ = *psVar14;
              local_228._24_8_ = plVar12[3];
              local_228._0_8_ = local_228 + 0x10;
            }
            else {
              local_228._16_8_ = *psVar14;
              local_228._0_8_ = (size_type *)*plVar12;
            }
            local_228._8_8_ = plVar12[1];
            *plVar12 = (long)psVar14;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            std::__cxx11::string::operator=((string *)local_1a8,(string *)local_228);
            if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
              operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          local_228._0_8_ = local_228 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,"INTERFACE_LINK_LIBRARIES","");
          AppendProperty(this,(string *)local_228,(string *)local_1a8);
          if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
            operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
          }
          if ((undefined1 *)local_1a8._0_8_ != local_198) {
            operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
          }
          return true;
        }
        local_1a8._0_8_ = local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"INTERFACE_LINK_LIBRARIES","");
        cmTarget::GetDebugGeneratorExpressions((string *)local_228,this->Target,lib,llt_00);
        AppendProperty(this,(string *)local_1a8,(string *)local_228);
        pcVar17 = local_228 + 0x10;
        if ((char *)local_228._0_8_ != pcVar17) {
          operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
        }
        if ((undefined1 *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
        }
        if (currentProcessingState == ProcessingLinkLibraries) {
          return true;
        }
        PVar6 = cmTarget::GetPolicyStatus(this->Target,CMP0022);
        if (WARN < PVar6) {
          return true;
        }
        TVar5 = cmTarget::GetType(this->Target);
        if (TVar5 != INTERFACE_LIBRARY) {
          this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
          cmake::GetDebugConfigs_abi_cxx11_(&local_1c0,this_01);
          local_228._8_8_ = (char *)0x0;
          local_228._16_8_ = local_228._16_8_ & 0xffffffffffffff00;
          local_228._0_8_ = pcVar17;
          if ((llt_00 < OPTIMIZED_LibraryType) &&
             (local_1f0 = (cmMakefile *)
                          local_1c0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
             local_1c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_1c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
            pcVar15 = (cmMakefile *)
                      local_1c0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              local_198._8_8_ =
                   (pcVar15->FindPackageRootPathStack).
                   super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map;
              local_198._0_8_ =
                   (pcVar15->FindPackageRootPathStack).
                   super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size;
              local_1a8._0_8_ = (pointer)0x19;
              local_1a8._8_8_ = "LINK_INTERFACE_LIBRARIES_";
              views_01._M_len = 2;
              views_01._M_array = (iterator)local_1a8;
              cmCatViews_abi_cxx11_(&local_1e8,views_01);
              std::__cxx11::string::operator=((string *)local_228,(string *)&local_1e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              AppendProperty(this,(string *)local_228,lib);
              pcVar15 = (cmMakefile *)
                        &(pcVar15->FindPackageRootPathStack).
                         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_last;
            } while (pcVar15 != local_1f0);
          }
          if ((local_1f4 & ~OPTIMIZED_LibraryType) == GENERAL_LibraryType) {
            local_1a8._0_8_ = local_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"LINK_INTERFACE_LIBRARIES","");
            AppendProperty(this,(string *)local_1a8,lib);
            if ((undefined1 *)local_1a8._0_8_ != local_198) {
              operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
            }
            if (local_1c0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_1c0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pcVar15 = (cmMakefile *)
                        local_1c0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                local_198._8_8_ =
                     (pcVar15->FindPackageRootPathStack).
                     super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_map;
                local_198._0_8_ =
                     (pcVar15->FindPackageRootPathStack).
                     super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_map_size;
                local_1a8._0_8_ = (pointer)0x19;
                local_1a8._8_8_ = "LINK_INTERFACE_LIBRARIES_";
                views_02._M_len = 2;
                views_02._M_array = (iterator)local_1a8;
                cmCatViews_abi_cxx11_(&local_1e8,views_02);
                std::__cxx11::string::operator=((string *)local_228,(string *)&local_1e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                cVar13 = cmTarget::GetProperty(this->Target,(string *)local_228);
                if (cVar13.Value == (string *)0x0) {
                  cmTarget::SetProperty(this->Target,(string *)local_228,"");
                }
                pcVar15 = (cmMakefile *)
                          &(pcVar15->FindPackageRootPathStack).
                           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last;
              } while (pcVar15 !=
                       (cmMakefile *)
                       local_1c0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
          }
          if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
            operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1c0);
          return true;
        }
        return true;
      }
      pcVar15 = this->Makefile;
      if (this->RejectRemoteLinking != true) {
        this_00 = cmMakefile::GetGlobalGenerator(pcVar15);
        pcVar10 = cmGlobalGenerator::FindTarget(this_00,lib,false);
        if (((((pcVar10 != (cmTarget *)0x0) &&
              (TVar5 = cmTarget::GetType(pcVar10), TVar5 != STATIC_LIBRARY)) &&
             (TVar5 = cmTarget::GetType(pcVar10), TVar5 != SHARED_LIBRARY)) &&
            ((TVar5 = cmTarget::GetType(pcVar10), TVar5 != UNKNOWN_LIBRARY &&
             (TVar5 = cmTarget::GetType(pcVar10), TVar5 != OBJECT_LIBRARY)))) &&
           ((TVar5 = cmTarget::GetType(pcVar10), TVar5 != INTERFACE_LIBRARY &&
            (bVar4 = cmTarget::IsExecutableWithExports(pcVar10), !bVar4)))) {
          local_1f0 = this->Makefile;
          local_1a8._0_8_ = (pointer)0x8;
          local_1a8._8_8_ = "Target \"";
          local_228._8_8_ = (lib->_M_dataplus)._M_p;
          local_228._0_8_ = lib->_M_string_length;
          TVar5 = cmTarget::GetType(pcVar10);
          psVar7 = cmState::GetTargetTypeName_abi_cxx11_(TVar5);
          cmStrCat<char[11],std::__cxx11::string,char[115],char[50]>
                    (&local_1e8,(cmAlphaNum *)local_1a8,(cmAlphaNum *)local_228,
                     (char (*) [11])"\" of type ",psVar7,
                     (char (*) [115])
                     " may not be linked into another target. One may link only to INTERFACE, OBJECT, STATIC or SHARED libraries, or to "
                     ,(char (*) [50])0x6fe94f);
          cmMakefile::IssueMessage(local_1f0,FATAL_ERROR,&local_1e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
        }
        local_1a8._0_8_ = local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"LINK_LIBRARIES","");
        AffectsProperty(this,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
        }
        cmTarget::AddLinkLibrary(this->Target,this->Makefile,lib,llt_00);
        id_00 = extraout_EDX_02;
        goto LAB_003564d9;
      }
      ppvVar2 = (_Map_pointer)(lib->_M_dataplus)._M_p;
      sVar11 = lib->_M_string_length;
      psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
      local_1a8._0_8_ = (char *)0x1d;
      local_1a8._8_8_ = "Attempt to add link library \"";
      local_188 = 0xd;
      local_180 = "\" to target \"";
      local_170 = (psVar7->_M_dataplus)._M_p;
      local_178 = psVar7->_M_string_length;
      local_168 = 0x5f;
      local_160 = 
      "\" which is not built in this directory.\nThis is allowed only when policy CMP0079 is set to NEW."
      ;
      views._M_len = 5;
      views._M_array = (iterator)local_1a8;
      local_198._0_8_ = sVar11;
      local_198._8_8_ = ppvVar2;
      cmCatViews_abi_cxx11_((string *)local_228,views);
      cmMakefile::IssueMessage(pcVar15,FATAL_ERROR,(string *)local_228);
      if ((undefined1 *)local_228._0_8_ == local_228 + 0x10) {
        return false;
      }
      goto LAB_00355ff4;
    }
    pcVar15 = this->Makefile;
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "IMPORTED library can only be used with the INTERFACE keyword of target_link_libraries"
               ,"");
    cmMakefile::IssueMessage(pcVar15,FATAL_ERROR,(string *)local_1a8);
  }
  else {
    pcVar15 = this->Makefile;
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,"");
    cmMakefile::IssueMessage(pcVar15,FATAL_ERROR,(string *)local_1a8);
  }
  local_228._16_8_ = local_198._0_8_;
  local_228._0_8_ = local_1a8._0_8_;
  if ((undefined1 *)local_1a8._0_8_ == local_198) {
    return false;
  }
LAB_00355ff4:
  operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
  return false;
}

Assistant:

bool TLL::HandleLibrary(ProcessingState currentProcessingState,
                        const std::string& lib, cmTargetLinkLibraryType llt)
{
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
      currentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile.IssueMessage(
      MessageType::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }
  if (this->Target->IsImported() &&
      currentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile.IssueMessage(
      MessageType::FATAL_ERROR,
      "IMPORTED library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }

  cmTarget::TLLSignature sig =
    (currentProcessingState == ProcessingPlainPrivateInterface ||
     currentProcessingState == ProcessingPlainPublicInterface ||
     currentProcessingState == ProcessingKeywordPrivateInterface ||
     currentProcessingState == ProcessingKeywordPublicInterface ||
     currentProcessingState == ProcessingKeywordLinkInterface)
    ? cmTarget::KeywordTLLSignature
    : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(
        sig, this->Makefile.GetBacktrace().Top())) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile.GetPolicyStatus(cmPolicies::CMP0023)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (modal) {
      // If the sig is a keyword form and there is a conflict, the existing
      // form must be the plain form.
      const char* existingSig =
        (sig == cmTarget::KeywordTLLSignature ? "plain" : "keyword");
      e << "The " << existingSig
        << " signature for target_link_libraries has "
           "already been used with the target \""
        << this->Target->GetName()
        << "\".  All uses of target_link_libraries with a target " << modal
        << " be either all-keyword or all-plain.\n";
      this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
      this->Makefile.IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  // Handle normal case where the command was called with another keyword than
  // INTERFACE / LINK_INTERFACE_LIBRARIES or none at all. (The "LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  if (currentProcessingState != ProcessingKeywordLinkInterface &&
      currentProcessingState != ProcessingPlainLinkInterface) {

    if (this->RejectRemoteLinking) {
      this->Makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Attempt to add link library \"", lib, "\" to target \"",
                 this->Target->GetName(),
                 "\" which is not built in this "
                 "directory.\nThis is allowed only when policy CMP0079 "
                 "is set to NEW."));
      return false;
    }

    cmTarget* tgt = this->Makefile.GetGlobalGenerator()->FindTarget(lib);

    if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::UNKNOWN_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::OBJECT_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
        !tgt->IsExecutableWithExports()) {
      this->Makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(
          "Target \"", lib, "\" of type ",
          cmState::GetTargetTypeName(tgt->GetType()),
          " may not be linked into another target. One may link only to "
          "INTERFACE, OBJECT, STATIC or SHARED libraries, or to ",
          "executables with the ENABLE_EXPORTS property set."));
    }

    this->AffectsProperty("LINK_LIBRARIES");
    this->Target->AddLinkLibrary(this->Makefile, lib, llt);
  }

  if (this->WarnRemoteInterface) {
    this->Makefile.IssueMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat(
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0079), "\nTarget\n  ",
        this->Target->GetName(),
        "\nis not created in this "
        "directory.  For compatibility with older versions of CMake, link "
        "library\n  ",
        lib,
        "\nwill be looked up in the directory in which "
        "the target was created rather than in this calling directory."));
  }

  // Handle (additional) case where the command was called with PRIVATE /
  // LINK_PRIVATE and stop its processing. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall only be populated if it is a
  // STATIC library.)
  if (currentProcessingState == ProcessingKeywordPrivateInterface ||
      currentProcessingState == ProcessingPlainPrivateInterface) {
    if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->Target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      std::string configLib =
        this->Target->GetDebugGeneratorExpressions(lib, llt);
      if (cmGeneratorExpression::IsValidTargetName(lib) ||
          cmGeneratorExpression::Find(lib) != std::string::npos) {
        configLib = "$<LINK_ONLY:" + configLib + ">";
      }
      this->AppendProperty("INTERFACE_LINK_LIBRARIES", configLib);
    }
    return true;
  }

  // Handle general case where the command was called with another keyword than
  // PRIVATE / LINK_PRIVATE or none at all. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  this->AppendProperty("INTERFACE_LINK_LIBRARIES",
                       this->Target->GetDebugGeneratorExpressions(lib, llt));

  // Stop processing if called without any keyword.
  if (currentProcessingState == ProcessingLinkLibraries) {
    return true;
  }
  // Stop processing if policy CMP0022 is set to NEW.
  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();
  if (policy22Status != cmPolicies::OLD &&
      policy22Status != cmPolicies::WARN) {
    return true;
  }
  // Stop processing if called with an INTERFACE library on the LHS.
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return true;
  }

  // Handle (additional) backward-compatibility case where the command was
  // called with PUBLIC / INTERFACE / LINK_PUBLIC / LINK_INTERFACE_LIBRARIES.
  // (The policy CMP0022 is not set to NEW.)
  {
    // Get the list of configurations considered to be DEBUG.
    std::vector<std::string> debugConfigs =
      this->Makefile.GetCMakeInstance()->GetDebugConfigs();
    std::string prop;

    // Include this library in the link interface for the target.
    if (llt == DEBUG_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the DEBUG configuration interfaces.
      for (std::string const& dc : debugConfigs) {
        prop = cmStrCat("LINK_INTERFACE_LIBRARIES_", dc);
        this->AppendProperty(prop, lib);
      }
    }
    if (llt == OPTIMIZED_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the non-DEBUG configuration interfaces.
      this->AppendProperty("LINK_INTERFACE_LIBRARIES", lib);

      // Make sure the DEBUG configuration interfaces exist so that the
      // general one will not be used as a fall-back.
      for (std::string const& dc : debugConfigs) {
        prop = cmStrCat("LINK_INTERFACE_LIBRARIES_", dc);
        if (!this->Target->GetProperty(prop)) {
          this->Target->SetProperty(prop, "");
        }
      }
    }
  }
  return true;
}